

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageSizeTests.cpp
# Opt level: O3

TestCaseGroup * vkt::image::createImageSizeTests(TestContext *testCtx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  undefined4 uVar3;
  uint uVar4;
  TestNode *this;
  TestNode *this_00;
  TestCaseGroup *pTVar5;
  TestNode *node;
  ImageType imageType;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  Texture texture;
  ostringstream str;
  _func_int **local_238;
  int local_230;
  undefined8 local_22c;
  int local_224;
  long local_220;
  TestContext *local_218;
  long *local_210;
  long local_200 [2];
  ulong local_1f0;
  long local_1e8;
  long local_1e0;
  char *local_1d8;
  long local_1d0;
  char *local_1c8;
  long local_1c0;
  int local_1b4 [3];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  this = (TestNode *)operator_new(0x70);
  local_218 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this,testCtx,"image_size","imageSize() cases");
  paVar1 = &local_1a8[0].field_2;
  local_220 = 0;
  do {
    this_00 = (TestNode *)operator_new(0x70);
    uVar2 = *(uint *)((anonymous_namespace)::s_imageTypes + local_220 * 4);
    getImageTypeName_abi_cxx11_(local_1a8,(image *)(ulong)uVar2,imageType);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)this_00,local_218,local_1a8[0]._M_dataplus._M_p,"");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    local_1f0 = (ulong)uVar2;
    lVar9 = 0;
    do {
      local_1c8 = "readonly_";
      if (lVar9 == 1) {
        local_1c8 = "";
      }
      local_1d0 = (ulong)(lVar9 != 1) * 9;
      local_1d8 = "writeonly_";
      if (lVar9 == 0) {
        local_1d8 = "";
      }
      local_1e0 = 10;
      if (lVar9 == 0) {
        local_1e0 = 0;
      }
      lVar8 = 0;
      local_1e8 = lVar9;
      do {
        if (uVar2 < 8) {
          pTVar5 = (TestCaseGroup *)
                   (*(code *)(&DAT_00b0c9f0 + *(int *)(&DAT_00b0c9f0 + local_1f0 * 4)))();
          return pTVar5;
        }
        local_1a8[0]._M_string_length._0_4_ = 0;
        local_1a8[0]._M_dataplus._M_p = (pointer)0x0;
        Texture::Texture((Texture *)&local_238,IMAGE_TYPE_LAST,(IVec3 *)local_1a8,0,1);
        node = (TestNode *)operator_new(0x90);
        uVar3 = (&(anonymous_namespace)::s_flags)[lVar9];
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_1c8,local_1d0)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_1d8,local_1e0)
        ;
        local_1c0 = lVar8;
        uVar4 = Texture::dimension((Texture *)&local_238);
        if (0 < (int)uVar4) {
          uVar6 = 0;
          do {
            pcVar7 = "";
            if (uVar6 != 0) {
              pcVar7 = "x";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,pcVar7,(ulong)(uVar6 != 0));
            Texture::size((Texture *)&local_238);
            std::ostream::operator<<(local_1a8,local_1b4[uVar6]);
            uVar6 = uVar6 + 1;
          } while (uVar4 != uVar6);
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"");
        tcu::TestCase::TestCase
                  ((TestCase *)node,local_218,(char *)local_210,local_1a8[0]._M_dataplus._M_p);
        node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cfe528;
        node[1]._vptr_TestNode = local_238;
        *(int *)&node[1].m_testCtx = local_230;
        *(undefined8 *)((long)&node[1].m_testCtx + 4) = local_22c;
        *(int *)((long)&node[1].m_name._M_dataplus._M_p + 4) = local_224;
        *(undefined4 *)&node[1].m_name._M_string_length = 0x6d;
        *(byte *)((long)&node[1].m_name._M_string_length + 4) = (byte)uVar3 & 1;
        *(byte *)((long)&node[1].m_name._M_string_length + 5) = (byte)uVar3 >> 1 & 1;
        tcu::TestNode::addChild(this_00,node);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        lVar8 = local_1c0;
        lVar9 = local_1e8;
        if (local_210 != local_200) {
          operator_delete(local_210,local_200[0] + 1);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    tcu::TestNode::addChild(this,this_00);
    local_220 = local_220 + 1;
  } while (local_220 != 8);
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createImageSizeTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> testGroup(new tcu::TestCaseGroup(testCtx, "image_size", "imageSize() cases"));

	const VkFormat format = VK_FORMAT_R32G32B32A32_SFLOAT;

	for (int imageTypeNdx = 0; imageTypeNdx < DE_LENGTH_OF_ARRAY(s_imageTypes); ++imageTypeNdx)
	{
		de::MovePtr<tcu::TestCaseGroup> imageGroup(new tcu::TestCaseGroup(testCtx, getImageTypeName(s_imageTypes[imageTypeNdx]).c_str(), ""));

		for (int flagNdx = 0; flagNdx < DE_LENGTH_OF_ARRAY(s_flags); ++flagNdx)
		for (int imageSizeNdx = 0; imageSizeNdx < DE_LENGTH_OF_ARRAY(s_baseImageSizes); ++imageSizeNdx)
		{
			const Texture texture = getTexture(s_imageTypes[imageTypeNdx], s_baseImageSizes[imageSizeNdx]);
			imageGroup->addChild(new SizeTest(testCtx, getCaseName(texture, s_flags[flagNdx]), "", texture, format, s_flags[flagNdx]));
		}

		testGroup->addChild(imageGroup.release());
	}
	return testGroup.release();
}